

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint64 ma_dr_wav_read_pcm_frames(ma_dr_wav *pWav,ma_uint64 framesToRead,void *pBufferOut)

{
  ma_uint64 mVar1;
  ulong uVar2;
  
  if ((pWav->container == ma_dr_wav_container_rifx) ||
     ((pWav->container == ma_dr_wav_container_aiff && ((pWav->aiff).isLE == '\0')))) {
    mVar1 = ma_dr_wav_read_pcm_frames_be(pWav,framesToRead,pBufferOut);
  }
  else {
    mVar1 = ma_dr_wav_read_pcm_frames_le(pWav,framesToRead,pBufferOut);
  }
  if ((((pWav->container == ma_dr_wav_container_aiff) && (pWav->bitsPerSample == 8)) &&
      (pBufferOut != (void *)0x0)) &&
     (((pWav->aiff).isUnsigned == '\0' && (pWav->channels * mVar1 != 0)))) {
    uVar2 = 0;
    do {
      *(byte *)((long)pBufferOut + uVar2) = *(byte *)((long)pBufferOut + uVar2) ^ 0x80;
      uVar2 = uVar2 + 1;
    } while (uVar2 < pWav->channels * mVar1);
  }
  return mVar1;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames(ma_dr_wav* pWav, ma_uint64 framesToRead, void* pBufferOut)
{
    ma_uint64 framesRead = 0;
    if (ma_dr_wav_is_container_be(pWav->container)) {
        if (pWav->container != ma_dr_wav_container_aiff || pWav->aiff.isLE == MA_FALSE) {
            if (ma_dr_wav__is_little_endian()) {
                framesRead = ma_dr_wav_read_pcm_frames_be(pWav, framesToRead, pBufferOut);
            } else {
                framesRead = ma_dr_wav_read_pcm_frames_le(pWav, framesToRead, pBufferOut);
            }
            goto post_process;
        }
    }
    if (ma_dr_wav__is_little_endian()) {
        framesRead = ma_dr_wav_read_pcm_frames_le(pWav, framesToRead, pBufferOut);
    } else {
        framesRead = ma_dr_wav_read_pcm_frames_be(pWav, framesToRead, pBufferOut);
    }
    post_process:
    {
        if (pWav->container == ma_dr_wav_container_aiff && pWav->bitsPerSample == 8 && pWav->aiff.isUnsigned == MA_FALSE) {
            if (pBufferOut != NULL) {
                ma_uint64 iSample;
                for (iSample = 0; iSample < framesRead * pWav->channels; iSample += 1) {
                    ((ma_uint8*)pBufferOut)[iSample] += 128;
                }
            }
        }
    }
    return framesRead;
}